

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_OpCodeConstructorTest_Test::TestBody(SignParameter_OpCodeConstructorTest_Test *this)

{
  ByteData expect_bytedata_msig;
  SigHashType local_134;
  SignParameter local_128;
  ByteData expect_bytedata_true;
  ByteData expect_bytedata_00;
  SignParameter sign_parameter;
  
  std::__cxx11::string::string((string *)&sign_parameter,"00",(allocator *)&local_128);
  cfd::core::ByteData::ByteData(&expect_bytedata_00,(string *)&sign_parameter);
  std::__cxx11::string::~string((string *)&sign_parameter);
  cfd::SignParameter::SignParameter
            (&sign_parameter,(ScriptOperator *)cfd::core::ScriptOperator::OP_0);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_128);
  cfd::core::SigHashType::SigHashType((SigHashType *)&expect_bytedata_true);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sign_parameter,(SignParameter *)&expect_bytedata_00,
             (ByteData *)0x4,(SignDataType)&local_128,(Pubkey *)0x0,SUB81(&expect_bytedata_true,0),
             (SigHashType *)&expect_bytedata_00,
             (ByteData *)
             expect_bytedata_msig.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  std::__cxx11::string::string((string *)&local_128,"51",(allocator *)&expect_bytedata_msig);
  cfd::core::ByteData::ByteData(&expect_bytedata_true,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  cfd::SignParameter::SignParameter(&local_128,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE)
  ;
  cfd::SignParameter::operator=(&sign_parameter,&local_128);
  cfd::SignParameter::~SignParameter(&local_128);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_128);
  cfd::core::SigHashType::SigHashType((SigHashType *)&expect_bytedata_msig);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sign_parameter,(SignParameter *)&expect_bytedata_true,
             (ByteData *)0x4,(SignDataType)&local_128,(Pubkey *)0x0,SUB81(&expect_bytedata_msig,0),
             (SigHashType *)&expect_bytedata_true,
             (ByteData *)
             expect_bytedata_msig.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  std::__cxx11::string::string((string *)&local_128,"ae",(allocator *)&local_134);
  cfd::core::ByteData::ByteData(&expect_bytedata_msig,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  cfd::SignParameter::SignParameter
            (&local_128,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKMULTISIG);
  cfd::SignParameter::operator=(&sign_parameter,&local_128);
  cfd::SignParameter::~SignParameter(&local_128);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_128);
  cfd::core::SigHashType::SigHashType(&local_134);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sign_parameter,(SignParameter *)&expect_bytedata_msig,
             (ByteData *)0x4,(SignDataType)&local_128,(Pubkey *)0x0,SUB81(&local_134,0),
             (SigHashType *)&expect_bytedata_msig,
             (ByteData *)
             expect_bytedata_msig.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expect_bytedata_msig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expect_bytedata_true);
  cfd::SignParameter::~SignParameter(&sign_parameter);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expect_bytedata_00);
  return;
}

Assistant:

TEST(SignParameter, OpCodeConstructorTest)
{
  const ByteData expect_bytedata_00("00");
  // constructor
  SignParameter sign_parameter = SignParameter(ScriptOperator::OP_0);
  CompareSignparameter(sign_parameter, expect_bytedata_00,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_00);

  const ByteData expect_bytedata_true("51");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_TRUE);
  CompareSignparameter(sign_parameter, expect_bytedata_true,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_true);

  const ByteData expect_bytedata_msig("ae");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_CHECKMULTISIG);
  CompareSignparameter(sign_parameter, expect_bytedata_msig,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_msig);
}